

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::base::Subprocess::Subprocess(Subprocess *this,Subprocess *other)

{
  pointer pMVar1;
  ResourceUsage *pRVar2;
  allocator_type local_29;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,(initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0),&local_29);
  (this->args).posix_argv0_override_for_testing._M_dataplus._M_p =
       (pointer)&(this->args).posix_argv0_override_for_testing.field_2;
  (this->args).posix_argv0_override_for_testing._M_string_length = 0;
  (this->args).posix_argv0_override_for_testing.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->args).posix_entrypoint_for_testing.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->args).posix_entrypoint_for_testing.super__Function_base._M_functor + 8) = 0;
  (this->args).posix_entrypoint_for_testing.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->args).posix_entrypoint_for_testing._M_invoker = (_Invoker_type)0x0;
  (this->args).posix_proc_group_id.super_OptionalBase<int>.storage_.
  super_OptionalStorageBase<int,_true> = (OptionalStorageBase<int,_true>)0x0;
  (this->args).env.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).env.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).env.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->args).preserve_fds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).preserve_fds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).preserve_fds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->args).input._M_dataplus._M_p = (pointer)&(this->args).input.field_2;
  (this->args).input._M_string_length = 0;
  (this->args).input.field_2._M_local_buf[0] = '\0';
  (this->args).stdin_mode = kBuffer;
  (this->args).stdout_mode = kInherit;
  (this->args).stderr_mode = kInherit;
  (this->args).out_fd = -1;
  (this->s_)._M_t.
  super___uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::Subprocess::MovableState_*,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  .super__Head_base<0UL,_perfetto::base::Subprocess::MovableState_*,_false>._M_head_impl =
       (MovableState *)0x0;
  pMVar1 = (other->s_)._M_t.
           super___uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::base::Subprocess::MovableState_*,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
           .super__Head_base<0UL,_perfetto::base::Subprocess::MovableState_*,_false>._M_head_impl;
  (other->s_)._M_t.
  super___uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::Subprocess::MovableState_*,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  .super__Head_base<0UL,_perfetto::base::Subprocess::MovableState_*,_false>._M_head_impl =
       (MovableState *)0x0;
  std::
  __uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ::reset((__uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
           *)&this->s_,pMVar1);
  Args::operator=(&this->args,&other->args);
  pMVar1 = (pointer)operator_new(0x68);
  *(undefined8 *)&(pMVar1->exit_status_pipe).wr = 0;
  pMVar1->input_written = 0;
  (pMVar1->rusage)._M_t.
  super___uniq_ptr_impl<perfetto::base::Subprocess::ResourceUsage,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  .super__Head_base<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_false>._M_head_impl =
       (ResourceUsage *)0x0;
  pMVar1->timed_out = false;
  *(undefined3 *)&pMVar1->field_0x49 = 0;
  (pMVar1->exit_status_pipe).rd = 0;
  (pMVar1->output).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pMVar1->output).field_2 + 8) = 0;
  (pMVar1->output)._M_dataplus._M_p = (pointer)0x0;
  (pMVar1->output)._M_string_length = 0;
  pMVar1->pid = 0;
  pMVar1->status = kNotStarted;
  *(undefined8 *)&pMVar1->returncode = 0;
  (pMVar1->stdin_pipe).rd = 0;
  (pMVar1->stdin_pipe).wr = 0;
  (pMVar1->stdouterr_pipe).rd = 0;
  (pMVar1->stdouterr_pipe).wr = 0;
  (pMVar1->waitpid_thread)._M_id._M_thread = 0;
  Pipe::Pipe((Pipe *)pMVar1);
  Pipe::Pipe(&pMVar1->stdouterr_pipe);
  pMVar1->status = kNotStarted;
  pMVar1->returncode = -1;
  (pMVar1->output)._M_dataplus._M_p = (pointer)&(pMVar1->output).field_2;
  (pMVar1->output)._M_string_length = 0;
  (pMVar1->output).field_2._M_local_buf[0] = '\0';
  pRVar2 = (ResourceUsage *)operator_new(0x1c);
  pRVar2->min_page_faults = 0;
  pRVar2->maj_page_faults = 0;
  pRVar2->vol_ctx_switch = 0;
  pRVar2->invol_ctx_switch = 0;
  pRVar2->cpu_utime_ms = 0;
  pRVar2->cpu_stime_ms = 0;
  pRVar2->max_rss_kb = 0;
  pRVar2->min_page_faults = 0;
  (pMVar1->rusage)._M_t.
  super___uniq_ptr_impl<perfetto::base::Subprocess::ResourceUsage,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  .super__Head_base<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_false>._M_head_impl = pRVar2;
  pMVar1->timed_out = false;
  Pipe::Pipe(&pMVar1->exit_status_pipe);
  pMVar1->input_written = 0;
  (pMVar1->waitpid_thread)._M_id._M_thread = 0;
  std::
  __uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ::reset((__uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
           *)&other->s_,pMVar1);
  ~Subprocess(other);
  Subprocess(other,(initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0));
  return;
}

Assistant:

Subprocess::Subprocess(Subprocess&& other) noexcept {
  static_assert(sizeof(Subprocess) ==
                    sizeof(std::tuple<std::unique_ptr<MovableState>, Args>),
                "base::Subprocess' move ctor needs updating");
  s_ = std::move(other.s_);
  args = std::move(other.args);

  // Reset the state of the moved-from object.
  other.s_.reset(new MovableState());
  other.~Subprocess();
  new (&other) Subprocess();
}